

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int idr_ensure_poolsize(archive_write *a,idr *idr,int cnt)

{
  uint uVar1;
  idrent *piVar2;
  int psize;
  int bk;
  void *p;
  int cnt_local;
  idr *idr_local;
  archive_write *a_local;
  
  if (idr->pool_size < cnt) {
    uVar1 = cnt + 0x7fU & 0xffffff80;
    piVar2 = (idrent *)realloc(idr->idrent_pool,(long)(int)uVar1 << 6);
    if (piVar2 == (idrent *)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
      return -0x1e;
    }
    idr->idrent_pool = piVar2;
    idr->pool_size = uVar1;
  }
  return 0;
}

Assistant:

static int
idr_ensure_poolsize(struct archive_write *a, struct idr *idr,
    int cnt)
{

	if (idr->pool_size < cnt) {
		void *p;
		const int bk = (1 << 7) - 1;
		int psize;

		psize = (cnt + bk) & ~bk;
		p = realloc(idr->idrent_pool, sizeof(struct idrent) * psize);
		if (p == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory");
			return (ARCHIVE_FATAL);
		}
		idr->idrent_pool = (struct idrent *)p;
		idr->pool_size = psize;
	}
	return (ARCHIVE_OK);
}